

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void mouse_button_callback(GLFWwindow *window,int button,int action,int mods)

{
  int mods_local;
  int action_local;
  int button_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    if (button == 0) {
      zoom = zoom - 0.1;
    }
    else if (button == 1) {
      zoom = zoom + 0.1;
    }
    if (0.1 <= zoom) {
      if (100.0 < zoom) {
        zoom = 100.0;
      }
    }
    else {
      zoom = 0.1;
    }
  }
  return;
}

Assistant:

void mouse_button_callback(GLFWwindow* window, int button, int action, int mods){
    if(action == GLFW_PRESS){
        switch(button){
            case GLFW_MOUSE_BUTTON_LEFT:
                zoom -= 0.1f;
                break;
            case GLFW_MOUSE_BUTTON_RIGHT:
                zoom += 0.1f;
            default:
                break;
        }
        if(zoom < 0.1f){
            zoom = 0.1f;
        } else if(zoom > 100.0f){
            zoom = 100.0f;
        }
    }
}